

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.cpp
# Opt level: O1

Token __thiscall slang::syntax::SyntaxNode::childToken(SyntaxNode *this,size_t index)

{
  Token TVar1;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar2;
  ConstGetChildVisitor *in_RCX;
  unsigned_long *in_R8;
  ConstTokenOrSyntax child;
  Token local_38;
  undefined1 local_28 [24];
  char local_10;
  
  local_28._0_8_ = index;
  detail::
  visitSyntaxNode<slang::syntax::SyntaxNode_const,(anonymous_namespace)::ConstGetChildVisitor,unsigned_long&>
            ((ConstTokenOrSyntax *)(local_28 + 8),(detail *)this,(SyntaxNode *)local_28,in_RCX,in_R8
            );
  if (local_10 == '\0') {
    pvVar2 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                        (local_28 + 8));
    local_38.kind = pvVar2->kind;
    local_38._2_1_ = pvVar2->field_0x2;
    local_38.numFlags.raw = (pvVar2->numFlags).raw;
    local_38.rawLen = pvVar2->rawLen;
    local_38.info = pvVar2->info;
  }
  else {
    parsing::Token::Token(&local_38);
  }
  TVar1.info = local_38.info;
  TVar1.kind = local_38.kind;
  TVar1._2_1_ = local_38._2_1_;
  TVar1.numFlags.raw = local_38.numFlags.raw;
  TVar1.rawLen = local_38.rawLen;
  return TVar1;
}

Assistant:

parsing::Token SyntaxNode::childToken(size_t index) const {
    auto child = getChild(index);
    if (!child.isToken())
        return Token();
    return child.token();
}